

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void iqnet::ssl::openssl_lock_callback(int mode,int n,char *param_3,int param_4)

{
  int iVar1;
  
  if (openssl_lock_callback(int,int,char_const*,int)::lks == '\0') {
    iVar1 = __cxa_guard_acquire(&openssl_lock_callback(int,int,char_const*,int)::lks);
    if (iVar1 != 0) {
      LockContainer::LockContainer(&openssl_lock_callback::lks);
      __cxa_atexit(LockContainer::~LockContainer,&openssl_lock_callback::lks,&__dso_handle);
      __cxa_guard_release(&openssl_lock_callback(int,int,char_const*,int)::lks);
    }
  }
  if ((mode & 1U) == 0) {
    boost::mutex::unlock(openssl_lock_callback::lks.locks + n);
    return;
  }
  boost::mutex::lock(openssl_lock_callback::lks.locks + n);
  return;
}

Assistant:

void
openssl_lock_callback(int mode, int n, const char* /*file*/, int /*line*/)
{
  static LockContainer lks;
  // assert n < lks.size

  boost::mutex& m = lks.locks[n];
  if (mode & CRYPTO_LOCK) {
    m.lock();
  } else {
    m.unlock();
  }
}